

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ucol_res.cpp
# Opt level: O0

void icu_63::CollationLoader::loadRules
               (char *localeID,char *collationType,UnicodeString *rules,UErrorCode *errorCode)

{
  UBool UVar1;
  size_t sVar2;
  UResourceBundle *pUVar3;
  UChar *srcChars;
  UChar *s;
  int32_t length;
  LocalUResourceBundlePointer data;
  LocalPointerBase<UResourceBundle> local_50;
  LocalUResourceBundlePointer collations;
  LocalUResourceBundlePointer bundle;
  char local_38 [4];
  int32_t typeLength;
  char type [16];
  UErrorCode *errorCode_local;
  UnicodeString *rules_local;
  char *collationType_local;
  char *localeID_local;
  
  type._8_8_ = errorCode;
  UVar1 = ::U_FAILURE(*errorCode);
  if (UVar1 == '\0') {
    sVar2 = strlen(collationType);
    if ((int)sVar2 < 0x10) {
      memcpy(local_38,collationType,(long)((int)sVar2 + 1));
      T_CString_toLowerCase_63(local_38);
      pUVar3 = ures_open_63("icudt63l-coll",localeID,(UErrorCode *)type._8_8_);
      LocalUResourceBundlePointer::LocalUResourceBundlePointer
                ((LocalUResourceBundlePointer *)&collations.super_LocalPointerBase<UResourceBundle>,
                 pUVar3);
      pUVar3 = LocalPointerBase<UResourceBundle>::getAlias
                         (&collations.super_LocalPointerBase<UResourceBundle>);
      pUVar3 = ures_getByKey_63(pUVar3,"collations",(UResourceBundle *)0x0,(UErrorCode *)type._8_8_)
      ;
      LocalUResourceBundlePointer::LocalUResourceBundlePointer
                ((LocalUResourceBundlePointer *)&local_50,pUVar3);
      pUVar3 = LocalPointerBase<UResourceBundle>::getAlias(&local_50);
      pUVar3 = ures_getByKeyWithFallback_63
                         (pUVar3,local_38,(UResourceBundle *)0x0,(UErrorCode *)type._8_8_);
      LocalUResourceBundlePointer::LocalUResourceBundlePointer
                ((LocalUResourceBundlePointer *)&stack0xffffffffffffff98,pUVar3);
      pUVar3 = LocalPointerBase<UResourceBundle>::getAlias
                         ((LocalPointerBase<UResourceBundle> *)&stack0xffffffffffffff98);
      srcChars = ures_getStringByKey_63
                           (pUVar3,"Sequence",(int32_t *)((long)&s + 4),(UErrorCode *)type._8_8_);
      UVar1 = ::U_FAILURE(*(UErrorCode *)type._8_8_);
      if (UVar1 == '\0') {
        UnicodeString::setTo(rules,srcChars,s._4_4_);
        UVar1 = UnicodeString::isBogus(rules);
        if (UVar1 != '\0') {
          *(undefined4 *)type._8_8_ = 7;
        }
      }
      LocalUResourceBundlePointer::~LocalUResourceBundlePointer
                ((LocalUResourceBundlePointer *)&stack0xffffffffffffff98);
      LocalUResourceBundlePointer::~LocalUResourceBundlePointer
                ((LocalUResourceBundlePointer *)&local_50);
      LocalUResourceBundlePointer::~LocalUResourceBundlePointer(&collations);
    }
    else {
      *(undefined4 *)type._8_8_ = 1;
    }
  }
  return;
}

Assistant:

void
CollationLoader::loadRules(const char *localeID, const char *collationType,
                           UnicodeString &rules, UErrorCode &errorCode) {
    if(U_FAILURE(errorCode)) { return; }
    U_ASSERT(collationType != NULL && *collationType != 0);
    // Copy the type for lowercasing.
    char type[16];
    int32_t typeLength = static_cast<int32_t>(uprv_strlen(collationType));
    if(typeLength >= UPRV_LENGTHOF(type)) {
        errorCode = U_ILLEGAL_ARGUMENT_ERROR;
        return;
    }
    uprv_memcpy(type, collationType, typeLength + 1);
    T_CString_toLowerCase(type);

    LocalUResourceBundlePointer bundle(ures_open(U_ICUDATA_COLL, localeID, &errorCode));
    LocalUResourceBundlePointer collations(
            ures_getByKey(bundle.getAlias(), "collations", NULL, &errorCode));
    LocalUResourceBundlePointer data(
            ures_getByKeyWithFallback(collations.getAlias(), type, NULL, &errorCode));
    int32_t length;
    const UChar *s =  ures_getStringByKey(data.getAlias(), "Sequence", &length, &errorCode);
    if(U_FAILURE(errorCode)) { return; }

    // No string pointer aliasing so that we need not hold onto the resource bundle.
    rules.setTo(s, length);
    if(rules.isBogus()) {
        errorCode = U_MEMORY_ALLOCATION_ERROR;
    }
}